

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

CURLcode Curl_http_setup_conn(connectdata *conn)

{
  CURLcode CVar1;
  void *pvVar2;
  
  pvVar2 = (*Curl_ccalloc)(1,0x88);
  if (pvVar2 == (void *)0x0) {
    CVar1 = CURLE_OUT_OF_MEMORY;
  }
  else {
    (conn->data->req).protop = pvVar2;
    CVar1 = CURLE_OK;
  }
  return CVar1;
}

Assistant:

CURLcode Curl_http_setup_conn(struct connectdata *conn)
{
  /* allocate the HTTP-specific struct for the Curl_easy, only to survive
     during this request */
  struct HTTP *http;
  DEBUGASSERT(conn->data->req.protop == NULL);

  http = calloc(1, sizeof(struct HTTP));
  if(!http)
    return CURLE_OUT_OF_MEMORY;

  conn->data->req.protop = http;

  Curl_http2_setup_conn(conn);
  Curl_http2_setup_req(conn->data);

  return CURLE_OK;
}